

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NonLocalBCImpl.H
# Opt level: O0

IntVect __thiscall
amrex::NonLocalBC::Rotate90ClockWise::operator()(Rotate90ClockWise *this,IntVect *iv)

{
  uint *in_RSI;
  IntVect IVar1;
  IntVect local_38;
  undefined4 local_2c;
  undefined4 local_1c;
  undefined4 local_c;
  int iVar2;
  
  local_c = 1;
  local_1c = 0;
  local_2c = 2;
  IntVect::IntVect(&local_38,in_RSI[1],~*in_RSI,in_RSI[2]);
  IVar1.vect[0] = local_38.vect[0];
  IVar1.vect[1] = local_38.vect[1];
  register0x00000010 = local_38.vect[2];
  return (IntVect)IVar1.vect;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    IntVect operator() (IntVect const& iv) const noexcept {
        return IntVect{AMREX_D_DECL(iv[1], -1-iv[0], iv[2])};
    }